

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void sorter_heap_sort(int64_t *dst,size_t size)

{
  int64_t iVar1;
  ulong in_RSI;
  int64_t *in_RDI;
  int64_t _sort_swap_temp;
  size_t end;
  size_t in_stack_ffffffffffffffd8;
  int64_t *in_stack_ffffffffffffffe0;
  long local_18;
  
  local_18 = in_RSI - 1;
  if (1 < in_RSI) {
    sorter_heapify(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    for (; local_18 != 0; local_18 = local_18 + -1) {
      iVar1 = in_RDI[local_18];
      in_RDI[local_18] = *in_RDI;
      *in_RDI = iVar1;
      sorter_heap_sift_down(in_RDI,0,local_18 - 1);
    }
  }
  return;
}

Assistant:

void HEAP_SORT(SORT_TYPE *dst, const size_t size) {
  size_t end = size - 1;

  /* don't bother sorting an array of size <= 1 */
  if (size <= 1) {
    return;
  }

  HEAPIFY(dst, size);

  while (end > 0) {
    SORT_SWAP(dst[end], dst[0]);
    HEAP_SIFT_DOWN(dst, 0, end - 1);
    end--;
  }
}